

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_iMultiFab.cpp
# Opt level: O0

Long __thiscall amrex::iMultiFab::sum(iMultiFab *this,int comp,int nghost,bool local)

{
  bool bVar1;
  _Atomic_word _Var2;
  byte in_CL;
  int in_ESI;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_int> *fab;
  Box *bx;
  MFIter mfi;
  Long sm;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffdd8;
  MFIter *in_stack_fffffffffffffde0;
  FabArray<amrex::IArrayBox> *this_00;
  int local_204;
  int local_200;
  undefined4 in_stack_fffffffffffffe04;
  FabArrayBase *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe4c;
  MFIter *in_stack_fffffffffffffe50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_16c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  MFIter local_148;
  RefID local_e8;
  byte local_d9;
  int local_d4;
  _Head_base<0UL,_amrex::FabFactory<amrex::IArrayBox>_*,_false> local_c8;
  _Atomic_word local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  int local_ac;
  int iStack_a8;
  _Atomic_word local_a4;
  pointer local_a0;
  int local_98;
  MultiArray4<int> local_90;
  int local_84;
  int iStack_80;
  int local_7c;
  int local_74;
  int local_70;
  int local_6c;
  FabArray<amrex::IArrayBox> *local_68;
  undefined4 local_5c;
  _Atomic_word *local_58;
  undefined4 local_4c;
  unique_ptr<amrex::PCData<amrex::IArrayBox>,_std::default_delete<amrex::PCData<amrex::IArrayBox>_>_>
  local_48;
  undefined4 local_3c;
  _Atomic_word *local_38;
  undefined4 local_2c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  undefined4 local_1c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  undefined4 local_c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_8;
  
  local_d9 = in_CL & 1;
  local_e8.data = (BARef *)0x0;
  local_d4 = in_ESI;
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 in_stack_fffffffffffffe08,SUB41((uint)in_stack_fffffffffffffe04 >> 0x18,0));
  while (bVar1 = MFIter::isValid(&local_148), bVar1) {
    in_stack_fffffffffffffdd8 = &local_16c;
    in_stack_fffffffffffffde0 = &local_148;
    MFIter::growntilebox(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    this_00 = (FabArray<amrex::IArrayBox> *)&stack0xfffffffffffffe48;
    local_150._M_pi = in_stack_fffffffffffffdd8;
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(this_00,in_stack_fffffffffffffde0);
    local_b8 = local_150._M_pi;
    local_8 = local_150._M_pi;
    local_c = 0;
    local_ac = *(int *)&(local_150._M_pi)->_vptr__Sp_counted_base;
    local_18 = local_150._M_pi;
    local_1c = 1;
    iStack_a8 = *(int *)((long)&(local_150._M_pi)->_vptr__Sp_counted_base + 4);
    local_c8._M_head_impl =
         (FabFactory<amrex::IArrayBox> *)(local_150._M_pi)->_vptr__Sp_counted_base;
    local_28 = local_150._M_pi;
    local_2c = 2;
    local_c0 = (local_150._M_pi)->_M_use_count;
    local_90.hp = (Array4<int> *)local_150._M_pi;
    local_38 = &(local_150._M_pi)->_M_weak_count;
    local_3c = 0;
    local_84 = *local_38;
    local_48._M_t.
    super___uniq_ptr_impl<amrex::PCData<amrex::IArrayBox>,_std::default_delete<amrex::PCData<amrex::IArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::PCData<amrex::IArrayBox>_*,_std::default_delete<amrex::PCData<amrex::IArrayBox>_>_>
    .super__Head_base<0UL,_amrex::PCData<amrex::IArrayBox>_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::PCData<amrex::IArrayBox>,_std::default_delete<amrex::PCData<amrex::IArrayBox>_>,_true,_true>
          )&(local_150._M_pi)->_M_weak_count;
    local_4c = 1;
    iStack_80 = *(int *)&local_150._M_pi[1]._vptr__Sp_counted_base;
    local_a0 = *(pointer *)local_38;
    local_58 = &(local_150._M_pi)->_M_weak_count;
    local_5c = 2;
    local_98 = *(int *)((long)&local_150._M_pi[1]._vptr__Sp_counted_base + 4);
    for (_Var2 = local_c0; local_200 = iStack_a8, _Var2 <= local_98; _Var2 = _Var2 + 1) {
      for (; local_204 = local_ac, local_200 <= iStack_80; local_200 = local_200 + 1) {
        for (; local_204 <= local_84; local_204 = local_204 + 1) {
          local_6c = local_204;
          local_70 = local_200;
          local_e8.data =
               (BARef *)((long)(&((local_e8.data)->bbox).smallend + -2) +
                        (long)*(int *)((long)(this_00->super_FabArrayBase)._vptr_FabArrayBase +
                                      ((long)(local_204 -
                                             (this_00->super_FabArrayBase).boxarray.m_bat.m_op.
                                             m_bndryReg.m_loshft.vect[0]) +
                                       (long)(local_200 -
                                             (this_00->super_FabArrayBase).boxarray.m_bat.m_op.
                                             m_bndryReg.m_loshft.vect[1]) *
                                       *(long *)&(this_00->super_FabArrayBase).boxarray.m_bat +
                                       (long)(_Var2 - (this_00->super_FabArrayBase).boxarray.m_bat.
                                                      m_op.m_bndryReg.m_loshft.vect[2]) *
                                       *(long *)((long)&(this_00->super_FabArrayBase).boxarray.m_bat
                                                        .m_op + 4) +
                                      (long)local_d4 *
                                      *(long *)((long)&(this_00->super_FabArrayBase).boxarray.m_bat.
                                                       m_op + 0xc)) * 4));
          local_74 = _Var2;
          local_68 = this_00;
        }
      }
    }
    local_a4 = local_c0;
    local_7c = local_98;
    MFIter::operator++(&local_148);
  }
  MFIter::~MFIter(in_stack_fffffffffffffde0);
  if ((local_d9 & 1) == 0) {
    ParallelContext::CommunicatorSub();
    ParallelAllReduce::Sum<long>
              ((long *)in_stack_fffffffffffffde0,
               (MPI_Comm)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
  }
  return (Long)local_e8.data;
}

Assistant:

Long
iMultiFab::sum (int comp, int nghost, bool local) const
{
    BL_PROFILE("iMultiFab::sum()");

    AMREX_ASSERT(nghost >= 0 && nghost <= n_grow.min());

    Long sm = 0;

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion())
    {
        auto const& ma = this->const_arrays();
        sm = ParReduce(TypeList<ReduceOpSum>{}, TypeList<Long>{}, *this, IntVect(nghost),
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Long>
        {
            return { static_cast<Long>(ma[box_no](i,j,k,comp)) };
        });
    }
    else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!system::regtest_reduction) reduction(+:sm)
#endif
        for (MFIter mfi(*this,true); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            Array4<int const> const& fab = this->const_array(mfi);
            AMREX_LOOP_3D(bx, i, j, k,
            {
                sm += fab(i,j,k,comp);
            });
        }
    }

    if (!local) {
        ParallelAllReduce::Sum(sm, ParallelContext::CommunicatorSub());
    }

    return sm;
}